

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void __thiscall pybind11::detail::instance::allocate_layout(instance *this)

{
  byte bVar1;
  PyTypeObject *t;
  ulong uVar2;
  byte extraout_AL;
  byte bVar3;
  byte extraout_AL_00;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var4;
  long *plVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  long lVar8;
  PyTypeObject *unaff_R15;
  long lVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar10;
  
  t = (this->ob_base).ob_type;
  pVar10 = all_type_info_get_cache(unaff_R15);
  _Var4 = pVar10.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  __x = extraout_XMM0_Qa;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)((long)_Var4.
                           super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                           ._M_cur + 0x10));
    __x = extraout_XMM0_Qa_00;
  }
  lVar9 = *(long *)((long)_Var4.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x18) -
          (long)*(long **)((long)_Var4.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x10) >> 3;
  if (lVar9 == 1) {
    uVar2 = *(ulong *)(**(long **)((long)_Var4.
                                         super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                         ._M_cur + 0x10) + 0x20);
    __x = log2((detail *)0x8,__x);
    bVar3 = (uVar2 <= (0xfUL >> (extraout_AL & 0x3f)) + 1) * '\x02';
  }
  else {
    if (lVar9 == 0) {
      pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types"
                   );
    }
    bVar3 = 0;
  }
  bVar1 = this->field_0x30;
  this->field_0x30 = bVar1 & 0xfd | bVar3;
  if (bVar3 == 0) {
    lVar8 = 0;
    for (plVar5 = *(long **)((long)_Var4.
                                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                   ._M_cur + 0x10);
        plVar5 != *(long **)((long)_Var4.
                                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                   ._M_cur + 0x18); plVar5 = plVar5 + 1) {
      lVar8 = lVar8 + *(long *)(*plVar5 + 0x20) + 1;
    }
    log2((detail *)0x8,__x);
    ppvVar6 = (void **)PyMem_Calloc(lVar8 + (lVar9 - 1U >> (extraout_AL_00 & 0x3f)) + 1,8);
    (this->field_1).nonsimple.values_and_holders = ppvVar6;
    if (ppvVar6 == (void **)0x0) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = operator_delete;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->field_1).simple_value_holder[1] = ppvVar6 + lVar8;
  }
  else {
    (this->field_1).simple_value_holder[0] = (void *)0x0;
    this->field_0x30 = bVar1 & 0xf1 | bVar3;
  }
  this->field_0x30 = this->field_0x30 | 1;
  return;
}

Assistant:

PYBIND11_NOINLINE inline void instance::allocate_layout() {
    auto &tinfo = all_type_info(Py_TYPE(this));

    const size_t n_types = tinfo.size();

    if (n_types == 0)
        pybind11_fail("instance allocation failed: new instance has no pybind11-registered base types");

    simple_layout =
        n_types == 1 && tinfo.front()->holder_size_in_ptrs <= instance_simple_holder_in_ptrs();

    // Simple path: no python-side multiple inheritance, and a small-enough holder
    if (simple_layout) {
        simple_value_holder[0] = nullptr;
        simple_holder_constructed = false;
        simple_instance_registered = false;
    }
    else { // multiple base types or a too-large holder
        // Allocate space to hold: [v1*][h1][v2*][h2]...[bb...] where [vN*] is a value pointer,
        // [hN] is the (uninitialized) holder instance for value N, and [bb...] is a set of bool
        // values that tracks whether each associated holder has been initialized.  Each [block] is
        // padded, if necessary, to an integer multiple of sizeof(void *).
        size_t space = 0;
        for (auto t : tinfo) {
            space += 1; // value pointer
            space += t->holder_size_in_ptrs; // holder instance
        }
        size_t flags_at = space;
        space += size_in_ptrs(n_types); // status bytes (holder_constructed and instance_registered)

        // Allocate space for flags, values, and holders, and initialize it to 0 (flags and values,
        // in particular, need to be 0).  Use Python's memory allocation functions: in Python 3.6
        // they default to using pymalloc, which is designed to be efficient for small allocations
        // like the one we're doing here; in earlier versions (and for larger allocations) they are
        // just wrappers around malloc.
#if PY_VERSION_HEX >= 0x03050000
        nonsimple.values_and_holders = (void **) PyMem_Calloc(space, sizeof(void *));
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
#else
        nonsimple.values_and_holders = (void **) PyMem_New(void *, space);
        if (!nonsimple.values_and_holders) throw std::bad_alloc();
        std::memset(nonsimple.values_and_holders, 0, space * sizeof(void *));
#endif
        nonsimple.status = reinterpret_cast<uint8_t *>(&nonsimple.values_and_holders[flags_at]);
    }
    owned = true;
}